

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_ycbcr_conversion
          (StateRecorder *this,VkSamplerYcbcrConversion conv,
          VkSamplerYcbcrConversionCreateInfo *create_info)

{
  VkSamplerYcbcrConversionCreateInfo *pVVar1;
  bool bVar2;
  mapped_type *ppVVar3;
  VkSamplerYcbcrConversionCreateInfo *local_38;
  VkSamplerYcbcrConversionCreateInfo *new_info;
  lock_guard<std::mutex> lock;
  VkSamplerYcbcrConversionCreateInfo *create_info_local;
  VkSamplerYcbcrConversion conv_local;
  StateRecorder *this_local;
  
  lock._M_device = (mutex_type *)create_info;
  create_info_local = (VkSamplerYcbcrConversionCreateInfo *)conv;
  conv_local = (VkSamplerYcbcrConversion)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&new_info,&this->impl->record_lock);
  local_38 = (mapped_type)0x0;
  bVar2 = Impl::copy_ycbcr_conversion
                    (this->impl,(VkSamplerYcbcrConversionCreateInfo *)lock._M_device,
                     &this->impl->ycbcr_temp_allocator,&local_38);
  pVVar1 = local_38;
  if (bVar2) {
    ppVVar3 = std::
              unordered_map<VkSamplerYcbcrConversion_T_*,_const_VkSamplerYcbcrConversionCreateInfo_*,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>_>
              ::operator[](&this->impl->ycbcr_conversions,(key_type *)&create_info_local);
    *ppVVar3 = pVVar1;
  }
  else {
    std::
    unordered_map<VkSamplerYcbcrConversion_T_*,_const_VkSamplerYcbcrConversionCreateInfo_*,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>_>
    ::erase(&this->impl->ycbcr_conversions,(key_type *)&create_info_local);
    this_local._7_1_ = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&new_info);
  if (bVar2) {
    Impl::pump_synchronized_recording(this->impl,this);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_ycbcr_conversion(VkSamplerYcbcrConversion conv,
                                            const VkSamplerYcbcrConversionCreateInfo &create_info)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkSamplerYcbcrConversionCreateInfo *new_info = nullptr;
		if (!impl->copy_ycbcr_conversion(&create_info, impl->ycbcr_temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->ycbcr_conversions.erase(conv);
			return false;
		}

		// We don't directly serialize these objects. Just remember it for later if a VkSampler is created.
		impl->ycbcr_conversions[conv] = new_info;
	}

	impl->pump_synchronized_recording(this);
	return true;
}